

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O1

_Bool Next_Choice(FIELDTYPE *typ,FIELD *field,TypeArgument *argp)

{
  _Bool _Var1;
  
  while( true ) {
    if ((typ == (FIELDTYPE *)0x0) || ((typ->status & 4) == 0)) {
      return false;
    }
    if ((typ->status & 1) == 0) {
      if (typ->next == (_func__Bool_FIELD_ptr_void_ptr *)0x0) {
        __assert_fail("typ->next != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CursesDialog/form/frm_driver.c"
                      ,0xa1e,"_Bool Next_Choice(FIELDTYPE *, FIELD *, TypeArgument *)");
      }
      _Var1 = (*typ->next)(field,argp);
      return _Var1;
    }
    if (argp == (TypeArgument *)0x0) break;
    _Var1 = Next_Choice(typ->left,field,argp->left);
    if (_Var1) {
      return true;
    }
    typ = typ->right;
    argp = argp->right;
  }
  __assert_fail("argp != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CursesDialog/form/frm_driver.c"
                ,0xa17,"_Bool Next_Choice(FIELDTYPE *, FIELD *, TypeArgument *)");
}

Assistant:

static bool Next_Choice(FIELDTYPE * typ, FIELD *field, TypeArgument *argp)
{
  if (!typ || !(typ->status & _HAS_CHOICE)) 
    return FALSE;

  if (typ->status & _LINKED_TYPE)
    {
      assert(argp != 0);
      return(
             Next_Choice(typ->left ,field,argp->left) ||
             Next_Choice(typ->right,field,argp->right) );
    } 
  else
    {
      assert(typ->next != 0);
      return typ->next(field,(void *)argp);
    }
}